

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineValidators
               (ostringstream *ret,
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *subroutineUniforms,GLenum shader,char *outTemporary)

{
  size_type sVar1;
  const_reference subroutineUniform;
  undefined8 local_30;
  size_t i;
  char *outTemporary_local;
  GLenum shader_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  ostringstream *ret_local;
  
  local_30 = 0;
  while( true ) {
    sVar1 = std::
            vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            ::size(subroutineUniforms);
    if (sVar1 <= local_30) break;
    subroutineUniform =
         std::
         vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
         ::operator[](subroutineUniforms,local_30);
    streamSubroutineValidator(ret,subroutineUniform,shader,outTemporary);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void streamSubroutineValidators(std::ostringstream&					 ret,
										   const std::vector<SubroutineUniform>& subroutineUniforms, GLenum shader,
										   const char* outTemporary)
	{
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			streamSubroutineValidator(ret, subroutineUniforms[i], shader, outTemporary);
		}
	}